

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O3

void ITransformOne(uint8_t *ref,int16_t *in,uint8_t *dst)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  long lVar8;
  int iVar9;
  int iVar12;
  int iVar13;
  undefined1 auVar10 [16];
  int iVar14;
  int iVar15;
  int iVar19;
  int iVar20;
  undefined1 in_XMM2 [16];
  undefined1 auVar16 [16];
  int iVar25;
  undefined1 in_XMM3 [16];
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  undefined8 local_58;
  undefined8 uStack_50;
  int C [16];
  undefined2 uVar11;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  uVar1 = *(ulong *)in;
  uVar11 = (undefined2)(uVar1 >> 0x30);
  auVar34._8_4_ = 0;
  auVar34._0_8_ = uVar1;
  auVar34._12_2_ = uVar11;
  auVar34._14_2_ = uVar11;
  uVar11 = (undefined2)(uVar1 >> 0x20);
  auVar10._12_4_ = auVar34._12_4_;
  auVar10._8_2_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10._10_2_ = uVar11;
  auVar28._10_6_ = auVar10._10_6_;
  auVar28._8_2_ = uVar11;
  auVar28._0_8_ = uVar1;
  uVar11 = (undefined2)(uVar1 >> 0x10);
  auVar3._4_8_ = auVar28._8_8_;
  auVar3._2_2_ = uVar11;
  auVar3._0_2_ = uVar11;
  iVar12 = auVar3._0_4_ >> 0x10;
  iVar13 = auVar28._8_4_ >> 0x10;
  uVar2 = *(undefined8 *)(in + 8);
  auVar18._0_12_ = in_XMM2._0_12_;
  auVar18._12_2_ = in_XMM2._6_2_;
  auVar18._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar17._12_4_ = auVar18._12_4_;
  auVar17._0_10_ = in_XMM2._0_10_;
  auVar17._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar16._10_6_ = auVar17._10_6_;
  auVar16._0_8_ = in_XMM2._0_8_;
  auVar16._8_2_ = in_XMM2._4_2_;
  auVar4._4_8_ = auVar16._8_8_;
  auVar4._2_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar4._0_2_ = in_XMM2._2_2_;
  iVar19 = auVar4._0_4_ >> 0x10;
  iVar20 = auVar16._8_4_ >> 0x10;
  iVar14 = (int)(short)uVar2 + (int)(short)uVar1;
  iVar15 = iVar19 + iVar12;
  iVar9 = (int)(short)uVar1 - (int)(short)uVar2;
  iVar12 = iVar12 - iVar19;
  uVar1 = *(ulong *)(in + 4);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar1;
  auVar23._0_12_ = in_XMM3._0_12_;
  auVar23._12_2_ = in_XMM3._6_2_;
  auVar23._14_2_ = (short)(uVar1 >> 0x30);
  auVar22._12_4_ = auVar23._12_4_;
  auVar22._0_10_ = in_XMM3._0_10_;
  auVar22._10_2_ = (short)(uVar1 >> 0x20);
  auVar21._10_6_ = auVar22._10_6_;
  auVar21._0_8_ = in_XMM3._0_8_;
  auVar21._8_2_ = in_XMM3._4_2_;
  auVar5._4_8_ = auVar21._8_8_;
  auVar5._2_2_ = (short)(uVar1 >> 0x10);
  auVar5._0_2_ = in_XMM3._2_2_;
  auVar24._0_4_ = (int)(short)uVar1;
  auVar24._4_4_ = auVar5._0_4_ >> 0x10;
  auVar24._8_4_ = auVar21._8_4_ >> 0x10;
  auVar24._12_4_ = auVar22._12_4_ >> 0x10;
  auVar26._4_4_ = auVar24._4_4_;
  auVar26._0_4_ = auVar24._4_4_;
  auVar26._8_4_ = auVar24._12_4_;
  auVar26._12_4_ = auVar24._12_4_;
  auVar34 = pmulhw(auVar33,_s__N_N_N_N_001b1bf0);
  auVar37._0_12_ = auVar34._0_12_;
  auVar37._12_2_ = auVar34._6_2_;
  auVar37._14_2_ = auVar34._6_2_;
  auVar36._12_4_ = auVar37._12_4_;
  auVar36._0_10_ = auVar34._0_10_;
  auVar36._10_2_ = auVar34._4_2_;
  auVar35._10_6_ = auVar36._10_6_;
  auVar35._0_8_ = auVar34._0_8_;
  auVar35._8_2_ = auVar34._4_2_;
  auVar6._4_8_ = auVar35._8_8_;
  auVar6._2_2_ = auVar34._2_2_;
  auVar6._0_2_ = auVar34._2_2_;
  uVar1 = *(ulong *)(in + 0xc);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar1;
  iVar39 = (int)(short)(uVar1 >> 0x10);
  iVar40 = (int)(short)(uVar1 >> 0x20);
  iVar41 = (int)(short)(uVar1 >> 0x30);
  auVar28 = pmulhw(auVar27,_s__N_N_N_N_001b1bf0);
  auVar31._0_12_ = auVar28._0_12_;
  auVar31._12_2_ = auVar28._6_2_;
  auVar31._14_2_ = auVar28._6_2_;
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._0_10_ = auVar28._0_10_;
  auVar30._10_2_ = auVar28._4_2_;
  auVar29._10_6_ = auVar30._10_6_;
  auVar29._0_8_ = auVar28._0_8_;
  auVar29._8_2_ = auVar28._4_2_;
  auVar7._4_8_ = auVar29._8_8_;
  auVar7._2_2_ = auVar28._2_2_;
  auVar7._0_2_ = auVar28._2_2_;
  iVar19 = (auVar24._0_4_ * 0x8a8c >> 0x10) - ((int)auVar28._0_2_ + (int)(short)uVar1);
  iVar25 = (auVar24._4_4_ * 0x8a8c >> 0x10) - ((auVar7._0_4_ >> 0x10) + iVar39);
  auVar32._4_4_ = iVar39;
  auVar32._0_4_ = iVar39;
  auVar32._8_4_ = iVar41;
  auVar32._12_4_ = iVar41;
  iVar38 = ((short)uVar1 * 0x8a8c >> 0x10) + auVar34._0_2_ + auVar24._0_4_;
  iVar39 = (iVar39 * 0x8a8c >> 0x10) + (auVar6._0_4_ >> 0x10) + auVar24._4_4_;
  C[10] = ((int)((auVar32._8_8_ & 0xffffffff) * 0x8a8c) >> 0x10) +
          (auVar36._12_4_ >> 0x10) + auVar24._12_4_ +
          (auVar17._12_4_ >> 0x10) + (auVar10._12_4_ >> 0x10);
  C[0xb] = (((int)((auVar26._8_8_ & 0xffffffff) * 0x8a8c) >> 0x10) -
           ((auVar30._12_4_ >> 0x10) + iVar41)) +
           ((auVar10._12_4_ >> 0x10) - (auVar17._12_4_ >> 0x10));
  C[6] = (iVar13 - iVar20) -
         (((int)((auVar24._8_8_ & 0xffffffff) * 0x8a8c) >> 0x10) -
         ((auVar29._8_4_ >> 0x10) + iVar40));
  C[7] = (iVar20 + iVar13) - ((iVar40 * 0x8a8c >> 0x10) + (auVar35._8_4_ >> 0x10) + auVar24._8_4_);
  C[2] = iVar39 + iVar15;
  C[3] = iVar25 + iVar12;
  C[4] = iVar12 - iVar25;
  C[5] = iVar15 - iVar39;
  local_58 = CONCAT44(iVar19 + iVar9,iVar38 + iVar14);
  uStack_50 = CONCAT44(iVar14 - iVar38,iVar9 - iVar19);
  lVar8 = 0;
  do {
    iVar9 = *(int *)((long)C + lVar8);
    iVar12 = *(int *)((long)C + lVar8 + 0x10);
    iVar14 = *(int *)((long)&local_58 + lVar8) + iVar12 + 4;
    iVar13 = *(int *)((long)C + lVar8 + 0x20);
    iVar19 = (iVar13 * 0x8a8c >> 0x10) + (iVar9 * 0x4e7b >> 0x10) + iVar9;
    iVar15 = (iVar19 + iVar14 >> 3) + (uint)ref[lVar8 * 8];
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    if (0xfe < iVar15) {
      iVar15 = 0xff;
    }
    iVar12 = (*(int *)((long)&local_58 + lVar8) + 4) - iVar12;
    iVar13 = (iVar9 * 0x8a8c >> 0x10) - ((iVar13 * 0x4e7b >> 0x10) + iVar13);
    dst[lVar8 * 8] = (uint8_t)iVar15;
    iVar9 = (iVar13 + iVar12 >> 3) + (uint)ref[lVar8 * 8 + 1];
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    dst[lVar8 * 8 + 1] = (uint8_t)iVar9;
    iVar9 = (iVar12 - iVar13 >> 3) + (uint)ref[lVar8 * 8 + 2];
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    dst[lVar8 * 8 + 2] = (uint8_t)iVar9;
    iVar9 = (iVar14 - iVar19 >> 3) + (uint)ref[lVar8 * 8 + 3];
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    dst[lVar8 * 8 + 3] = (uint8_t)iVar9;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x10);
  return;
}

Assistant:

static WEBP_INLINE void ITransformOne(const uint8_t* WEBP_RESTRICT ref,
                                      const int16_t* WEBP_RESTRICT in,
                                      uint8_t* WEBP_RESTRICT dst) {
  int C[4 * 4], *tmp;
  int i;
  tmp = C;
  for (i = 0; i < 4; ++i) {    // vertical pass
    const int a = in[0] + in[8];
    const int b = in[0] - in[8];
    const int c =
        WEBP_TRANSFORM_AC3_MUL2(in[4]) - WEBP_TRANSFORM_AC3_MUL1(in[12]);
    const int d =
        WEBP_TRANSFORM_AC3_MUL1(in[4]) + WEBP_TRANSFORM_AC3_MUL2(in[12]);
    tmp[0] = a + d;
    tmp[1] = b + c;
    tmp[2] = b - c;
    tmp[3] = a - d;
    tmp += 4;
    in++;
  }

  tmp = C;
  for (i = 0; i < 4; ++i) {    // horizontal pass
    const int dc = tmp[0] + 4;
    const int a = dc + tmp[8];
    const int b = dc - tmp[8];
    const int c =
        WEBP_TRANSFORM_AC3_MUL2(tmp[4]) - WEBP_TRANSFORM_AC3_MUL1(tmp[12]);
    const int d =
        WEBP_TRANSFORM_AC3_MUL1(tmp[4]) + WEBP_TRANSFORM_AC3_MUL2(tmp[12]);
    STORE(0, i, a + d);
    STORE(1, i, b + c);
    STORE(2, i, b - c);
    STORE(3, i, a - d);
    tmp++;
  }
}